

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O1

void __thiscall
libtorrent::session_handle::dht_put_item
          (session_handle *this,array<char,_32UL> key,
          function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *cb,string *salt)

{
  async_call<void(libtorrent::aux::session_impl::*)(std::array<char,32ul>,std::function<void(libtorrent::entry&,std::array<char,64ul>&,long&,std::__cxx11::string_const&)>,std::__cxx11::string),std::array<char,32ul>&,std::function<void(libtorrent::entry&,std::array<char,64ul>&,long&,std::__cxx11::string_const&)>&,std::__cxx11::string&>
            (this,0x2d55bc,(array<char,_32UL> *)0x0,
             (function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cb);
  return;
}

Assistant:

void session_handle::dht_put_item(std::array<char, 32> key
		, std::function<void(entry&, std::array<char,64>&
			, std::int64_t&, std::string const&)> cb
		, std::string salt)
	{
#ifndef TORRENT_DISABLE_DHT
		async_call(&session_impl::dht_put_mutable_item, key, cb, salt);
#else
		TORRENT_UNUSED(key);
		TORRENT_UNUSED(cb);
		TORRENT_UNUSED(salt);
#endif
	}